

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testWav.cpp
# Opt level: O3

void anon_unknown.dwarf_2eea51::test(int nx,int ny)

{
  ulong uVar1;
  ulong uVar2;
  size_t __n;
  ushort uVar3;
  ostream *this;
  long *plVar4;
  unsigned_short *puVar5;
  unsigned_short *puVar6;
  long lVar7;
  unsigned_short *puVar8;
  unsigned_short *puVar9;
  unsigned_short uVar10;
  ulong uVar11;
  ulong uVar12;
  Array2D<unsigned_short> b;
  Array2D<unsigned_short> a;
  Rand48 rand48;
  Array2D<unsigned_short> local_68;
  Array2D<unsigned_short> local_50;
  ushort local_36 [3];
  
  uVar1 = (ulong)(uint)ny;
  uVar2 = (ulong)(uint)nx;
  this = (ostream *)std::ostream::operator<<(&std::cout,nx);
  std::__ostream_insert<char,std::char_traits<char>>(this," x ",3);
  plVar4 = (long *)std::ostream::operator<<(this,ny);
  std::ios::widen((char)*(undefined8 *)(*plVar4 + -0x18) + (char)plVar4);
  std::ostream::put((char)plVar4);
  std::ostream::flush();
  __n = uVar2 * 2;
  local_50._sizeX = uVar1;
  local_50._sizeY = uVar2;
  puVar5 = (unsigned_short *)operator_new__(__n * uVar1);
  local_68._sizeX = uVar1;
  local_68._sizeY = uVar2;
  local_50._data = puVar5;
  puVar6 = (unsigned_short *)operator_new__(__n * uVar1);
  local_36[0] = 0x5a5a;
  local_36[1] = 0x5a5a;
  local_36[2] = 0x5a5a;
  local_68._data = puVar6;
  if (0 < ny) {
    uVar12 = 0;
    puVar8 = puVar6;
    puVar9 = puVar5;
    do {
      if (0 < nx) {
        uVar11 = 0;
        do {
          lVar7 = Imath_2_5::nrand48(local_36);
          uVar3 = (ushort)lVar7 & 0x3fff;
          puVar8[uVar11] = uVar3;
          puVar9[uVar11] = uVar3;
          uVar11 = uVar11 + 1;
        } while (uVar2 != uVar11);
      }
      uVar12 = uVar12 + 1;
      puVar9 = puVar9 + uVar2;
      puVar8 = puVar8 + uVar2;
    } while (uVar12 != uVar1);
  }
  wavEncodeDecode(&local_50,&local_68,nx,ny);
  if (0 < ny) {
    uVar12 = 0;
    puVar8 = puVar5;
    puVar9 = puVar6;
    do {
      if (0 < nx) {
        uVar11 = 0;
        do {
          lVar7 = Imath_2_5::nrand48(local_36);
          puVar9[uVar11] = (unsigned_short)lVar7;
          puVar8[uVar11] = (unsigned_short)lVar7;
          uVar11 = uVar11 + 1;
        } while (uVar2 != uVar11);
      }
      uVar12 = uVar12 + 1;
      puVar8 = puVar8 + uVar2;
      puVar9 = puVar9 + uVar2;
    } while (uVar12 != uVar1);
  }
  wavEncodeDecode(&local_50,&local_68,nx,ny);
  if (0 < ny) {
    lVar7 = 0;
    uVar12 = uVar1;
    do {
      if (0 < nx) {
        memset((void *)((long)puVar6 + lVar7),0,__n);
        memset((void *)((long)puVar5 + lVar7),0,__n);
      }
      lVar7 = lVar7 + __n;
      uVar12 = uVar12 - 1;
    } while (uVar12 != 0);
  }
  wavEncodeDecode(&local_50,&local_68,nx,ny);
  if (0 < ny) {
    uVar12 = 0;
    puVar8 = puVar6;
    puVar9 = puVar5;
    do {
      if (0 < nx) {
        uVar11 = 0;
        do {
          puVar8[uVar11] = 1;
          puVar9[uVar11] = 1;
          uVar11 = uVar11 + 1;
        } while (uVar2 != uVar11);
      }
      uVar12 = uVar12 + 1;
      puVar9 = puVar9 + uVar2;
      puVar8 = puVar8 + uVar2;
    } while (uVar12 != uVar1);
  }
  wavEncodeDecode(&local_50,&local_68,nx,ny);
  if (0 < ny) {
    uVar12 = 0;
    puVar8 = puVar6;
    puVar9 = puVar5;
    do {
      if (0 < nx) {
        uVar11 = 0;
        do {
          puVar8[uVar11] = 0x3ffe;
          puVar9[uVar11] = 0x3ffe;
          uVar11 = uVar11 + 1;
        } while (uVar2 != uVar11);
      }
      uVar12 = uVar12 + 1;
      puVar9 = puVar9 + uVar2;
      puVar8 = puVar8 + uVar2;
    } while (uVar12 != uVar1);
  }
  wavEncodeDecode(&local_50,&local_68,nx,ny);
  if (0 < ny) {
    uVar12 = 0;
    puVar8 = puVar6;
    puVar9 = puVar5;
    do {
      if (0 < nx) {
        uVar11 = 0;
        do {
          puVar8[uVar11] = 0x3fff;
          puVar9[uVar11] = 0x3fff;
          uVar11 = uVar11 + 1;
        } while (uVar2 != uVar11);
      }
      uVar12 = uVar12 + 1;
      puVar9 = puVar9 + uVar2;
      puVar8 = puVar8 + uVar2;
    } while (uVar12 != uVar1);
  }
  wavEncodeDecode(&local_50,&local_68,nx,ny);
  if (0 < ny) {
    uVar12 = 0;
    puVar8 = puVar6;
    puVar9 = puVar5;
    do {
      if (0 < nx) {
        uVar11 = 0;
        do {
          puVar8[uVar11] = 0xfffe;
          puVar9[uVar11] = 0xfffe;
          uVar11 = uVar11 + 1;
        } while (uVar2 != uVar11);
      }
      uVar12 = uVar12 + 1;
      puVar9 = puVar9 + uVar2;
      puVar8 = puVar8 + uVar2;
    } while (uVar12 != uVar1);
  }
  wavEncodeDecode(&local_50,&local_68,nx,ny);
  if (0 < ny) {
    lVar7 = 0;
    uVar12 = uVar1;
    do {
      if (0 < nx) {
        memset((void *)((long)puVar6 + lVar7),0xff,__n);
        memset((void *)((long)puVar5 + lVar7),0xff,__n);
      }
      lVar7 = lVar7 + __n;
      uVar12 = uVar12 - 1;
    } while (uVar12 != 0);
  }
  wavEncodeDecode(&local_50,&local_68,nx,ny);
  if (0 < ny) {
    uVar12 = 0;
    puVar8 = puVar6;
    puVar9 = puVar5;
    do {
      if (0 < nx) {
        uVar11 = 0;
        do {
          uVar10 = 0;
          if ((uVar11 & 1) == 0) {
            uVar10 = 0x3fff;
          }
          puVar8[uVar11] = uVar10;
          puVar9[uVar11] = uVar10;
          uVar11 = uVar11 + 1;
        } while (uVar2 != uVar11);
      }
      uVar12 = uVar12 + 1;
      puVar9 = puVar9 + uVar2;
      puVar8 = puVar8 + uVar2;
    } while (uVar12 != uVar1);
  }
  wavEncodeDecode(&local_50,&local_68,nx,ny);
  if (0 < ny) {
    uVar12 = 0;
    puVar8 = puVar6;
    puVar9 = puVar5;
    do {
      if (0 < nx) {
        uVar11 = 0;
        do {
          uVar10 = ((ushort)uVar11 & 1) - 1;
          puVar8[uVar11] = uVar10;
          puVar9[uVar11] = uVar10;
          uVar11 = uVar11 + 1;
        } while (uVar2 != uVar11);
      }
      uVar12 = uVar12 + 1;
      puVar9 = puVar9 + uVar2;
      puVar8 = puVar8 + uVar2;
    } while (uVar12 != uVar1);
  }
  wavEncodeDecode(&local_50,&local_68,nx,ny);
  if (0 < ny) {
    uVar12 = 0;
    puVar8 = puVar6;
    puVar9 = puVar5;
    do {
      if (0 < nx) {
        uVar10 = 0;
        if ((uVar12 & 1) == 0) {
          uVar10 = 0x3fff;
        }
        uVar11 = 0;
        do {
          puVar8[uVar11] = uVar10;
          puVar9[uVar11] = uVar10;
          uVar11 = uVar11 + 1;
        } while (uVar2 != uVar11);
      }
      uVar12 = uVar12 + 1;
      puVar9 = puVar9 + uVar2;
      puVar8 = puVar8 + uVar2;
    } while (uVar12 != uVar1);
  }
  wavEncodeDecode(&local_50,&local_68,nx,ny);
  if (0 < ny) {
    uVar12 = 0;
    puVar8 = puVar6;
    puVar9 = puVar5;
    do {
      if (0 < nx) {
        uVar10 = ((ushort)uVar12 & 1) - 1;
        uVar11 = 0;
        do {
          puVar8[uVar11] = uVar10;
          puVar9[uVar11] = uVar10;
          uVar11 = uVar11 + 1;
        } while (uVar2 != uVar11);
      }
      uVar12 = uVar12 + 1;
      puVar9 = puVar9 + uVar2;
      puVar8 = puVar8 + uVar2;
    } while (uVar12 != uVar1);
  }
  wavEncodeDecode(&local_50,&local_68,nx,ny);
  if (0 < ny) {
    uVar12 = 0;
    puVar8 = puVar6;
    puVar9 = puVar5;
    do {
      if (0 < nx) {
        uVar11 = 0;
        do {
          uVar10 = 0x3fff;
          if (((int)uVar12 + (int)uVar11 & 1U) != 0) {
            uVar10 = 0;
          }
          puVar8[uVar11] = uVar10;
          puVar9[uVar11] = uVar10;
          uVar11 = uVar11 + 1;
        } while (uVar2 != uVar11);
      }
      uVar12 = uVar12 + 1;
      puVar9 = puVar9 + uVar2;
      puVar8 = puVar8 + uVar2;
    } while (uVar12 != uVar1);
  }
  wavEncodeDecode(&local_50,&local_68,nx,ny);
  if (0 < ny) {
    uVar12 = 0;
    puVar8 = puVar6;
    puVar9 = puVar5;
    do {
      if (0 < nx) {
        uVar11 = 0;
        do {
          uVar10 = ((short)uVar12 + (short)uVar11 & 1U) - 1;
          puVar8[uVar11] = uVar10;
          puVar9[uVar11] = uVar10;
          uVar11 = uVar11 + 1;
        } while (uVar2 != uVar11);
      }
      uVar12 = uVar12 + 1;
      puVar9 = puVar9 + uVar2;
      puVar8 = puVar8 + uVar2;
    } while (uVar12 != uVar1);
  }
  wavEncodeDecode(&local_50,&local_68,nx,ny);
  operator_delete__(puVar6);
  operator_delete__(puVar5);
  return;
}

Assistant:

void
test (int nx, int ny)
{
    cout << nx << " x " << ny << endl;

    Array2D<unsigned short> a (ny, nx);
    Array2D<unsigned short> b (ny, nx);

    IMATH_NAMESPACE::Rand48 rand48 (0);

    fill1_14bit (a, b, nx, ny, rand48);
    wavEncodeDecode (a, b, nx, ny);

    fill1_16bit (a, b, nx, ny, rand48);
    wavEncodeDecode (a, b, nx, ny);

    fill2 (a, b, nx, ny, 0);
    wavEncodeDecode (a, b, nx, ny);

    fill2 (a, b, nx, ny, 1);
    wavEncodeDecode (a, b, nx, ny);

    fill2 (a, b, nx, ny, 0x3ffe);
    wavEncodeDecode (a, b, nx, ny);

    fill2 (a, b, nx, ny, 0x3fff);
    wavEncodeDecode (a, b, nx, ny);

    fill2 (a, b, nx, ny, 0xfffe);
    wavEncodeDecode (a, b, nx, ny);

    fill2 (a, b, nx, ny, 0xffff);
    wavEncodeDecode (a, b, nx, ny);

    fill3_14bit (a, b, nx, ny);
    wavEncodeDecode (a, b, nx, ny);

    fill3_16bit (a, b, nx, ny);
    wavEncodeDecode (a, b, nx, ny);

    fill4_14bit (a, b, nx, ny);
    wavEncodeDecode (a, b, nx, ny);

    fill4_16bit (a, b, nx, ny);
    wavEncodeDecode (a, b, nx, ny);

    fill5_14bit (a, b, nx, ny);
    wavEncodeDecode (a, b, nx, ny);

    fill5_16bit (a, b, nx, ny);
    wavEncodeDecode (a, b, nx, ny);
}